

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  DbPage *pDbPage;
  PgHdr *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
  if (*pRC != 0) goto LAB_00141cf6;
  if (key == 1) {
    uVar5 = 0;
  }
  else {
    if (key == 0) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x118b0,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      *pRC = 0xb;
      goto LAB_00141cf6;
    }
    iVar2 = (key - 2) - (key - 2) % (pBt->usableSize / 5 + 1);
    uVar5 = iVar2 + (uint)(iVar2 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  iVar2 = (*pBt->pPager->xGet)(pBt->pPager,uVar5,&local_38,0);
  if (iVar2 != 0) {
    *pRC = iVar2;
    goto LAB_00141cf6;
  }
  if (*local_38->pExtra == '\0') {
    uVar5 = (~uVar5 + key) * 5;
    if ((int)uVar5 < 0) {
      uVar3 = 0x118c2;
      goto LAB_00141de6;
    }
    pvVar1 = local_38->pData;
    uVar4 = (ulong)uVar5;
    if ((*(u8 *)((long)pvVar1 + uVar4) != eType) ||
       (uVar5 = *(uint *)((long)pvVar1 + uVar4 + 1),
       (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) != parent))
    {
      iVar2 = sqlite3PagerWrite(local_38);
      *pRC = iVar2;
      if (iVar2 == 0) {
        *(u8 *)((long)pvVar1 + uVar4) = eType;
        *(char *)((long)pvVar1 + uVar4 + 1) = (char)(parent >> 0x18);
        *(char *)((long)pvVar1 + uVar4 + 2) = (char)(parent >> 0x10);
        *(char *)((long)pvVar1 + uVar4 + 3) = (char)(parent >> 8);
        *(char *)((long)pvVar1 + uVar4 + 4) = (char)parent;
      }
    }
  }
  else {
    uVar3 = 0x118bd;
LAB_00141de6:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar3,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    *pRC = 0xb;
  }
  if (local_38 != (DbPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_38);
  }
LAB_00141cf6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The super-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  if( ((char*)sqlite3PagerGetExtra(pDbPage))[0]!=0 ){
    /* The first byte of the extra data is the MemPage.isInit byte.
    ** If that byte is set, it means this page is also being used
    ** as a btree page. */
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %u->(%u,%u)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}